

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O1

string * format_error<std::__cxx11::string,unsigned_int_const&,unsigned_int_const&>
                   (string *__return_storage_ptr__,Options *options,char *type,
                   optional<const_TokenStream::TextStream_&> *stream,char *filename,uint32_t lineno,
                   uint32_t colno,uint32_t length,char *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   uint *args_1,uint *args_2)

{
  uint32_t uVar1;
  uint *args_00;
  uint *args_1_00;
  char cVar2;
  char cVar3;
  unreachable_exception *this;
  uint32_t uVar4;
  char cVar5;
  undefined4 in_register_0000008c;
  uint *args_2_00;
  CStringRef arg0;
  bool bVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6;
  uint32_t lineno_local;
  string __str;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  anon_class_32_4_eb191f4b make_helper;
  string local_90;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  
  args_1_00 = args_2;
  args_00 = args_1;
  arg0.data_ = (char *)args;
  args_2_00 = (uint *)CONCAT44(in_register_0000008c,lineno);
  make_helper.lineno = &lineno_local;
  make_helper.colno = &colno;
  make_helper.length = &length;
  lineno_local = lineno;
  make_helper.stream = stream;
  if (options->error_format == JSON) {
    if (filename == (char *)0x0) {
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"null","");
    }
    else {
      local_40.__data = filename;
      local_40.__size = strlen(filename);
      arg0.data_ = (char *)args;
      escape_string_abi_cxx11_(&__str,&local_40,'\"',true);
    }
    if (type == (char *)0x0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"null","");
    }
    else {
      local_50.__data = type;
      local_50.__size = strlen(type);
      escape_string_abi_cxx11_(&local_110,&local_50,'\"',true);
    }
    fmt::format<std::__cxx11::string,unsigned_int,unsigned_int>
              (&local_d0,(fmt *)msg,arg0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00,
               args_1_00,args_2_00);
    local_60.__data = local_d0._M_dataplus._M_p;
    local_60.__size = local_d0._M_string_length;
    escape_string_abi_cxx11_(&local_90,&local_60,'\"',true);
    bVar6 = stream->ref == (TextStream *)0x0;
    bVar7 = lineno_local == 0;
    if (bVar7 || bVar6) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      args_6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18c193;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"null","");
    }
    else {
      format_error<std::__cxx11::string,unsigned_int_const&,unsigned_int_const&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,std::__cxx11::string&&,unsigned_int_const&,unsigned_int_const&)
      ::{lambda()#1}::operator()[abi_cxx11_(&local_f0,&make_helper);
      local_70.__data = local_f0._M_dataplus._M_p;
      local_70.__size = local_f0._M_string_length;
      args_6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18c170;
      escape_string_abi_cxx11_(&local_130,&local_70,'\"',true);
    }
    fmt::
    format<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,
               (fmt *)
               "{{\"file\": {}, \"type\": {}, \"line\": {}, \"column\": {}, \"length\": {}, \"message\": {}, \"helper\": {}}}"
               ,(CStringRef)&__str,&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineno_local,
               &colno,&length,(uint *)&local_90,&local_130,args_6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar7 && !bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p == &__str.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (options->error_format != Default) {
      this = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/program.hpp(418)."
                );
      __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar5 = (char)__return_storage_ptr__;
    if (filename == (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back(cVar5);
    }
    uVar1 = lineno_local;
    if (lineno_local != 0) {
      cVar3 = '\x01';
      if (9 < lineno_local) {
        uVar4 = lineno_local;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (uVar4 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_0018c2f4;
          }
          if (uVar4 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_0018c2f4;
          }
          if (uVar4 < 10000) goto LAB_0018c2f4;
          bVar6 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar6);
        cVar3 = cVar3 + '\x01';
      }
LAB_0018c2f4:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)__str._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back(cVar5);
    }
    uVar1 = colno;
    if (colno != 0 && lineno_local != 0) {
      cVar3 = '\x01';
      if (9 < colno) {
        uVar4 = colno;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (uVar4 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_0018c3c9;
          }
          if (uVar4 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_0018c3c9;
          }
          if (uVar4 < 10000) goto LAB_0018c3c9;
          bVar6 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar6);
        cVar3 = cVar3 + '\x01';
      }
LAB_0018c3c9:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)__str._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back(cVar5);
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back(cVar5);
    }
    if (type != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    fmt::format<std::__cxx11::string,unsigned_int,unsigned_int>
              (&__str,(fmt *)msg,arg0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00,args_2,
               args_2_00);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)__str._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (stream->ref == (TextStream *)0x0) {
      return __return_storage_ptr__;
    }
    if (lineno_local == 0) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back(cVar5);
    format_error<std::__cxx11::string,unsigned_int_const&,unsigned_int_const&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,std::__cxx11::string&&,unsigned_int_const&,unsigned_int_const&)
    ::{lambda()#1}::operator()[abi_cxx11_(&__str,&make_helper);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)__str._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p == &__str.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& options,
                                const char* type,
                                optional<const TokenStream::TextStream&> stream,
                                const char* filename, uint32_t lineno, uint32_t colno, uint32_t length,
                                const char* msg, Args&&... args)
{
    auto make_helper = [&]() -> std::string
    {
        Expects(stream && lineno && colno);

        std::string arrow_line;
        std::string line = stream->get_line(lineno);
        arrow_line.reserve(colno + length);

        for(size_t i = 0; i < colno; ++i)
            arrow_line.push_back(line[i] != '\t'? ' ' : '\t');
        arrow_line.back() = '^';

        for(size_t i = 1; i < length; ++i)
            arrow_line.push_back('~');

        return fmt::format(" {}\n {}", line, arrow_line);
    };

    if(options.error_format == Options::ErrorFormat::Default)
    {
        std::string message;
        message.reserve(255);

        if(filename)
        {
            message += filename;
            message.push_back(':');
        }
        else
        {
            message += "gta3sc:";
        }

        if(lineno)
        {
            message += std::to_string(lineno);
            message.push_back(':');
        }

        if(lineno && colno)
        {
            message += std::to_string(colno);
            message.push_back(':');
        }

        if(message.size())
        {
            message.push_back(' ');
        }

        if(type)
        {
            message += type;
            message += ": ";
        }

        message += fmt::format(msg, std::forward<Args>(args)...);

        if(stream && lineno)
        {
            message.push_back('\n');
            message += make_helper();
        }

        return message;
    }
    else if(options.error_format == Options::ErrorFormat::JSON)
    {
        /*
            This is the JSON object to be printed (in a single line!):
            {
                "file": string | null,
                "type": string | null, // "error", "warning", "note" or "fatal error"
                "line": integer,        // 0 means no line information
                "column": integer,      // 0 means no column information
                "length": integer,      // 0 means no length information
                "message": string,
                "helper": string | null,
            }
        */
        return fmt::format(R"({{"file": {}, "type": {}, "line": {}, "column": {}, "length": {}, "message": {}, "helper": {}}})",
                            filename? make_quoted(filename) : "null",
                            type? make_quoted(type) : "null",
                            lineno, colno, length,  // line, column, length
                            make_quoted(fmt::format(msg, std::forward<Args>(args)...)),
                            stream && lineno? make_quoted(make_helper()) : "null");

    }
    else
    {
        Unreachable();
    }
}